

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxbmhandler.cpp
# Opt level: O2

ssize_t __thiscall QXbmHandler::write(QXbmHandler *this,int __fd,void *__buf,size_t __n)

{
  undefined1 uVar1;
  uint uVar2;
  uint uVar3;
  Format FVar4;
  QRgb QVar5;
  int iVar6;
  int iVar7;
  QIODevice *pQVar8;
  char *__s;
  ulong uVar9;
  uchar *puVar10;
  size_t sVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  undefined4 in_register_00000034;
  ulong uVar16;
  undefined1 *puVar17;
  long in_FS_OFFSET;
  int local_a8;
  QArrayDataPointer<char> local_98;
  undefined1 local_78 [16];
  QImageData *local_68;
  undefined1 local_58 [10];
  char acStack_4e [22];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = QImageIOHandler::device(&this->super_QImageIOHandler);
  local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_78,(QImage *)CONCAT44(in_register_00000034,__fd));
  uVar2 = QImage::width((QImage *)local_78);
  uVar3 = QImage::height((QImage *)local_78);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QString::toUtf8_helper((QString *)&local_98);
  puVar17 = (undefined1 *)(local_98.size + 100);
  __s = (char *)operator_new__((ulong)puVar17);
  pcVar13 = local_98.ptr;
  if (local_98.ptr == (char *)0x0) {
    pcVar13 = (char *)&QByteArray::_empty;
  }
  snprintf(__s,(size_t)puVar17,"#define %s_width %d\n",pcVar13,(ulong)uVar2);
  strlen(__s);
  QIODevice::write((char *)pQVar8,(longlong)__s);
  pcVar13 = local_98.ptr;
  if (local_98.ptr == (char *)0x0) {
    pcVar13 = (char *)&QByteArray::_empty;
  }
  snprintf(__s,(size_t)puVar17,"#define %s_height %d\n",pcVar13,(ulong)uVar3);
  strlen(__s);
  QIODevice::write((char *)pQVar8,(longlong)__s);
  snprintf(__s,(size_t)puVar17,"static char %s_bits[] = {\n ");
  strlen(__s);
  QIODevice::write((char *)pQVar8,(longlong)__s);
  FVar4 = QImage::format((QImage *)local_78);
  if (FVar4 != Format_MonoLSB) {
    QImage::convertToFormat_helper
              ((QImage *)local_58,(QImage *)local_78,Format_MonoLSB,(ImageConversionFlags)0x0);
    QImage::operator=((QImage *)local_78,(QImage *)local_58);
    QImage::~QImage((QImage *)local_58);
  }
  QVar5 = QImage::color((QImage *)local_78,0);
  iVar6 = qGray(QVar5);
  QVar5 = QImage::color((QImage *)local_78,1);
  iVar7 = qGray(QVar5);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
  for (lVar15 = 0; lVar15 != 10; lVar15 = lVar15 + 1) {
    local_58[lVar15] = (char)lVar15 + '0';
  }
  for (lVar15 = 10; lVar15 != 0x10; lVar15 = lVar15 + 1) {
    local_58[lVar15] = (char)lVar15 + 'W';
  }
  if (iVar6 < iVar7) {
    puVar17 = local_58;
    for (lVar15 = 0xf; lVar15 != 7; lVar15 = lVar15 + -1) {
      uVar1 = local_58[lVar15];
      local_58[lVar15] = *puVar17;
      *puVar17 = uVar1;
      puVar17 = puVar17 + 1;
    }
  }
  uVar14 = (long)(int)(uVar2 + 7) / 8;
  iVar6 = (int)uVar14;
  uVar16 = 0;
  uVar14 = uVar14 & 0xffffffff;
  if (iVar6 < 1) {
    uVar14 = uVar16;
  }
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar9 = uVar16;
  }
  pcVar13 = __s;
  for (iVar7 = 0; local_a8 = (int)uVar9, iVar7 != local_a8; iVar7 = iVar7 + 1) {
    puVar10 = QImage::constScanLine((QImage *)local_78,iVar7);
    for (lVar15 = 0; (int)uVar14 != (int)lVar15; lVar15 = lVar15 + 1) {
      pcVar13[0] = '0';
      pcVar13[1] = 'x';
      pcVar13[2] = local_58[puVar10[lVar15] >> 4];
      pcVar13[3] = local_58[puVar10[lVar15] & 0xf];
      if ((int)lVar15 < iVar6 + -1 || iVar7 < (int)(uVar3 - 1)) {
        pcVar13[4] = ',';
        if ((int)uVar16 < 0xe) {
          uVar16 = (ulong)((int)uVar16 + 1);
          pcVar13 = pcVar13 + 5;
        }
        else {
          pcVar13[5] = '\n';
          pcVar13[6] = ' ';
          pcVar13[7] = '\0';
          sVar11 = strlen(__s);
          lVar12 = QIODevice::write((char *)pQVar8,(longlong)__s);
          uVar16 = 0;
          pcVar13 = __s;
          if ((int)sVar11 != lVar12) goto LAB_00297b6b;
        }
      }
      else {
        pcVar13 = pcVar13 + 4;
      }
    }
  }
  builtin_strncpy(pcVar13," };\n",5);
  sVar11 = strlen(__s);
  lVar15 = QIODevice::write((char *)pQVar8,(longlong)__s);
  uVar16 = CONCAT71((int7)(uVar16 >> 8),(int)sVar11 == lVar15);
LAB_00297b6b:
  operator_delete__(__s);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  QImage::~QImage((QImage *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar16;
  }
  __stack_chk_fail();
}

Assistant:

bool QXbmHandler::write(const QImage &image)
{
    return write_xbm_image(image, device(), fileName);
}